

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::FileClassName_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FileDescriptor *file)

{
  bool bVar1;
  FileOptions *pFVar2;
  string *psVar3;
  string local_90;
  string local_70 [48];
  long local_40;
  size_type last_slash;
  string basename;
  FileDescriptor *file_local;
  
  basename.field_2._8_8_ = this;
  pFVar2 = FileDescriptor::options((FileDescriptor *)this);
  bVar1 = FileOptions::has_java_outer_classname(pFVar2);
  if (bVar1) {
    pFVar2 = FileDescriptor::options((FileDescriptor *)basename.field_2._8_8_);
    psVar3 = FileOptions::java_outer_classname_abi_cxx11_(pFVar2);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  }
  else {
    std::__cxx11::string::string((string *)&last_slash);
    psVar3 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)basename.field_2._8_8_);
    local_40 = std::__cxx11::string::find_last_of((char)psVar3,0x2f);
    if (local_40 == -1) {
      psVar3 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)basename.field_2._8_8_);
      std::__cxx11::string::operator=((string *)&last_slash,(string *)psVar3);
    }
    else {
      psVar3 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)basename.field_2._8_8_);
      std::__cxx11::string::substr((ulong)local_70,(ulong)psVar3);
      std::__cxx11::string::operator=((string *)&last_slash,local_70);
      std::__cxx11::string::~string(local_70);
    }
    StripProto(&local_90,(string *)&last_slash);
    anon_unknown_0::UnderscoresToCamelCaseImpl(__return_storage_ptr__,&local_90,true);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&last_slash);
  }
  return __return_storage_ptr__;
}

Assistant:

string FileClassName(const FileDescriptor* file) {
  if (file->options().has_java_outer_classname()) {
    return file->options().java_outer_classname();
  } else {
    string basename;
    string::size_type last_slash = file->name().find_last_of('/');
    if (last_slash == string::npos) {
      basename = file->name();
    } else {
      basename = file->name().substr(last_slash + 1);
    }
    return UnderscoresToCamelCaseImpl(StripProto(basename), true);
  }
}